

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall file::file(file *this)

{
  allocator local_31;
  string local_30 [32];
  file *local_10;
  file *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)&this->typeName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,8,' ',&local_31);
  std::__cxx11::string::operator=((string *)&this->typeName,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

file::file() {
    typeName = std::string(8, ' ');
}